

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O1

void Gia_ManInseSimulateObj(Gia_Man_t *p,int Id)

{
  void *pvVar1;
  void *pvVar2;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  word wVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  
  if ((-1 < Id) && (Id < p->nObjs)) {
    uVar5 = *(ulong *)(p->pObjs + (uint)Id);
    uVar12 = (uint)uVar5;
    uVar13 = (uint)(uVar5 >> 0x20);
    if ((uVar5 & 0x1fffffff) == 0x1fffffff || (int)uVar12 < 0) {
      if ((int)uVar12 < 0 && (int)(uVar5 & 0x1fffffff) != 0x1fffffff) {
        pvVar6 = p->pData;
        iVar11 = p->iData;
        lVar10 = (long)iVar11;
        pvVar1 = (void *)((long)pvVar6 + (long)(int)((Id - (uVar12 & 0x1fffffff)) * iVar11 * 2) * 8)
        ;
        pvVar2 = (void *)((long)pvVar1 + lVar10 * 8);
        pvVar8 = pvVar1;
        if ((uVar12 >> 0x1d & 1) == 0) {
          pvVar8 = pvVar2;
          pvVar2 = pvVar1;
        }
        if (0 < lVar10) {
          lVar14 = 0;
          do {
            *(undefined8 *)((long)pvVar6 + lVar14 * 8 + (long)(Id * iVar11 * 2) * 8) =
                 *(undefined8 *)((long)pvVar2 + lVar14 * 8);
            *(undefined8 *)((long)pvVar6 + lVar14 * 8 + lVar10 * 8 + (long)(Id * iVar11 * 2) * 8) =
                 *(undefined8 *)((long)pvVar8 + lVar14 * 8);
            lVar14 = lVar14 + 1;
          } while (lVar10 != lVar14);
        }
      }
      else if ((uVar12 & 0x9fffffff) == 0x9fffffff) {
        if ((int)(uVar13 & 0x1fffffff) < p->vCis->nSize - p->nRegs) {
          iVar11 = p->iData;
          if (0 < (long)iVar11) {
            pvVar1 = p->pData;
            lVar10 = 0;
            do {
              wVar9 = Gia_ManRandomW(0);
              *(word *)((long)pvVar1 + lVar10 * 8 + (long)(Id * iVar11 * 2) * 8) = wVar9;
              *(word *)((long)pvVar1 + lVar10 * 8 + (long)iVar11 * 8 + (long)(Id * iVar11 * 2) * 8)
                   = ~wVar9;
              lVar10 = lVar10 + 1;
            } while (lVar10 < p->iData);
          }
        }
        else {
          iVar11 = p->vCis->nSize;
          if ((int)(uVar13 & 0x1fffffff) < iVar11 - p->nRegs) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar4 = p->vCos->nSize;
          uVar12 = (iVar4 - iVar11) + (uVar13 & 0x1fffffff);
          if (((int)uVar12 < 0) || (iVar4 <= (int)uVar12)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar11 = p->vCos->pArray[uVar12];
          if ((iVar11 < 0) || (p->nObjs <= iVar11)) goto LAB_00597ba8;
          iVar4 = p->iData;
          lVar10 = (long)iVar4;
          if (0 < lVar10) {
            pvVar1 = p->pData;
            lVar14 = 0;
            do {
              *(undefined8 *)((long)pvVar1 + lVar14 * 8 + (long)(Id * iVar4 * 2) * 8) =
                   *(undefined8 *)((long)pvVar1 + lVar14 * 8 + (long)(iVar11 * iVar4 * 2) * 8);
              *(undefined8 *)((long)pvVar1 + lVar14 * 8 + lVar10 * 8 + (long)(Id * iVar4 * 2) * 8) =
                   *(undefined8 *)
                    ((long)pvVar1 + lVar14 * 8 + lVar10 * 8 + (long)(iVar11 * iVar4 * 2) * 8);
              lVar14 = lVar14 + 1;
            } while (lVar10 != lVar14);
          }
        }
      }
      else {
        if ((~uVar5 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcInse.c"
                        ,0x9f,"void Gia_ManInseSimulateObj(Gia_Man_t *, int)");
        }
        lVar10 = (long)p->iData;
        if (0 < lVar10) {
          iVar11 = Id * p->iData;
          pvVar1 = p->pData;
          lVar14 = 0;
          do {
            *(undefined8 *)((long)pvVar1 + lVar14 * 8 + (long)(iVar11 * 2) * 8) = 0xffffffffffffffff
            ;
            *(undefined8 *)((long)pvVar1 + lVar14 * 8 + lVar10 * 8 + (long)(iVar11 * 2) * 8) = 0;
            lVar14 = lVar14 + 1;
          } while (lVar10 != lVar14);
        }
      }
    }
    else {
      pvVar6 = p->pData;
      iVar11 = p->iData;
      lVar10 = (long)iVar11;
      pvVar1 = (void *)((long)pvVar6 + (long)(int)((Id - (uVar12 & 0x1fffffff)) * iVar11 * 2) * 8);
      pvVar2 = (void *)((long)pvVar1 + lVar10 * 8);
      pvVar8 = pvVar1;
      if ((uVar12 >> 0x1d & 1) == 0) {
        pvVar8 = pvVar2;
        pvVar2 = pvVar1;
      }
      pvVar1 = (void *)((long)pvVar6 + (long)(int)((Id - (uVar13 & 0x1fffffff)) * iVar11 * 2) * 8);
      pvVar3 = (void *)((long)pvVar1 + lVar10 * 8);
      pvVar7 = pvVar1;
      if ((uVar5 >> 0x3d & 1) == 0) {
        pvVar7 = pvVar3;
        pvVar3 = pvVar1;
      }
      if (0 < lVar10) {
        lVar14 = 0;
        do {
          *(ulong *)((long)pvVar6 + lVar14 * 8 + (long)(Id * iVar11 * 2) * 8) =
               *(ulong *)((long)pvVar3 + lVar14 * 8) | *(ulong *)((long)pvVar2 + lVar14 * 8);
          *(ulong *)((long)pvVar6 + lVar14 * 8 + lVar10 * 8 + (long)(Id * iVar11 * 2) * 8) =
               *(ulong *)((long)pvVar7 + lVar14 * 8) & *(ulong *)((long)pvVar8 + lVar14 * 8);
          lVar14 = lVar14 + 1;
        } while (lVar10 != lVar14);
      }
    }
    return;
  }
LAB_00597ba8:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManInseSimulateObj( Gia_Man_t * p, int Id )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, Id );
    word * pData0, * pDataA0, * pDataB0;
    word * pData1, * pDataA1, * pDataB1;
    int i;
    if ( Gia_ObjIsAnd(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
            if ( Gia_ObjFaninC1(pObj) )
            {
                pDataB1 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB0 = pDataB1 + p->iData;
            }
            else 
            {
                pDataB0 = Gia_ParTestObj( p, Gia_ObjFaninId1(pObj, Id) );
                pDataB1 = pDataB0 + p->iData;
            }
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i] | pDataB0[i], pData1[i] = pDataA1[i] & pDataB1[i];
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        if ( Gia_ObjFaninC0(pObj) )
        {
            pDataA1 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA0 = pDataA1 + p->iData;
        }
        else 
        {
            pDataA0 = Gia_ParTestObj( p, Gia_ObjFaninId0(pObj, Id) );
            pDataA1 = pDataA0 + p->iData;
        }
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
    }
    else if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p, pObj) )
        {
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = Gia_ManRandomW(0), pData1[i] = ~pData0[i];
        }
        else
        {
            int Id2 = Gia_ObjId(p, Gia_ObjRoToRi(p, pObj));
            pData0  = Gia_ParTestObj( p, Id );
            pData1  = pData0 + p->iData;
            pDataA0 = Gia_ParTestObj( p, Id2 );
            pDataA1 = pDataA0 + p->iData;
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pDataA0[i], pData1[i] = pDataA1[i];
        }
    }
    else if ( Gia_ObjIsConst0(pObj) )
    {
        pData0  = Gia_ParTestObj( p, Id );
        pData1  = pData0 + p->iData;
        for ( i = 0; i < p->iData; i++ )
            pData0[i] = ~(word)0, pData1[i] = 0;
    }
    else assert( 0 );
}